

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_load(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  GCstr *pGVar3;
  ulong uVar4;
  GCstr *pGVar5;
  ulong uVar6;
  GCstr *name;
  MSize MVar7;
  
  pGVar2 = lj_lib_optstr(L,2);
  pGVar3 = lj_lib_optstr(L,3);
  if (L->base < L->top) {
    uVar4 = L->base->u64;
    uVar6 = (long)uVar4 >> 0x2f;
    if ((uVar6 < 0xfffffffffffffff3 || uVar6 == 0xfffffffffffffffb) ||
       ((uVar6 == 0xfffffffffffffff3 && (*(char *)((uVar4 & 0x7fffffffffff) + 10) == '\x03')))) {
      if (((uint)(uVar4 >> 0x2f) == 0x1fff3) &&
         (uVar4 = uVar4 & 0x7fffffffffff, *(char *)(uVar4 + 10) == '\x03')) {
        pGVar5 = *(GCstr **)(uVar4 + 0x58);
        MVar7 = *(int *)(uVar4 + 0x30) - (int)pGVar5;
        if (pGVar2 == (GCstr *)0x0) {
          pGVar2 = (GCstr *)((L->glref).ptr64 + 0x78);
        }
      }
      else {
        pGVar5 = lj_lib_checkstr(L,1);
        MVar7 = pGVar5->len;
        pGVar5 = pGVar5 + 1;
      }
      lua_settop(L,4);
      name = pGVar2 + 1;
      if (pGVar2 == (GCstr *)0x0) {
        name = pGVar5;
      }
      pGVar2 = pGVar3 + 1;
      if (pGVar3 == (GCstr *)0x0) {
        pGVar2 = (GCstr *)0x0;
      }
      iVar1 = luaL_loadbufferx(L,(char *)pGVar5,(ulong)MVar7,(char *)name,(char *)pGVar2);
      goto LAB_0014cb84;
    }
  }
  lj_lib_checkfunc(L,1);
  lua_settop(L,5);
  pGVar5 = (GCstr *)"=(load)";
  if (pGVar2 != (GCstr *)0x0) {
    pGVar5 = pGVar2 + 1;
  }
  pGVar2 = pGVar3 + 1;
  if (pGVar3 == (GCstr *)0x0) {
    pGVar2 = (GCstr *)0x0;
  }
  iVar1 = lua_loadx(L,reader_func,(void *)0x0,(char *)pGVar5,(char *)pGVar2);
LAB_0014cb84:
  iVar1 = load_aux(L,iVar1,4);
  return iVar1;
}

Assistant:

LJLIB_CF(load)
{
  GCstr *name = lj_lib_optstr(L, 2);
  GCstr *mode = lj_lib_optstr(L, 3);
  int status;
  if (L->base < L->top &&
      (tvisstr(L->base) || tvisnumber(L->base) || tvisbuf(L->base))) {
    const char *s;
    MSize len;
    if (tvisbuf(L->base)) {
      SBufExt *sbx = bufV(L->base);
      s = sbx->r;
      len = sbufxlen(sbx);
      if (!name) name = &G(L)->strempty;  /* Buffers are not NUL-terminated. */
    } else {
      GCstr *str = lj_lib_checkstr(L, 1);
      s = strdata(str);
      len = str->len;
    }
    lua_settop(L, 4);  /* Ensure env arg exists. */
    status = luaL_loadbufferx(L, s, len, name ? strdata(name) : s,
			      mode ? strdata(mode) : NULL);
  } else {
    lj_lib_checkfunc(L, 1);
    lua_settop(L, 5);  /* Reserve a slot for the string from the reader. */
    status = lua_loadx(L, reader_func, NULL, name ? strdata(name) : "=(load)",
		       mode ? strdata(mode) : NULL);
  }
  return load_aux(L, status, 4);
}